

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

_Bool Curl_clone_primary_ssl_config(ssl_primary_config *source,ssl_primary_config *dest)

{
  char *pcVar1;
  ssl_primary_config *dest_local;
  ssl_primary_config *source_local;
  
  dest->version = source->version;
  dest->version_max = source->version_max;
  dest->verifypeer = (_Bool)(source->verifypeer & 1);
  dest->verifyhost = (_Bool)(source->verifyhost & 1);
  dest->verifystatus = (_Bool)(source->verifystatus & 1);
  dest->sessionid = (_Bool)(source->sessionid & 1);
  if (source->CApath == (char *)0x0) {
    dest->CApath = (char *)0x0;
  }
  else {
    pcVar1 = (*Curl_cstrdup)(source->CApath);
    dest->CApath = pcVar1;
    if (dest->CApath == (char *)0x0) {
      return false;
    }
  }
  if (source->CAfile == (char *)0x0) {
    dest->CAfile = (char *)0x0;
  }
  else {
    pcVar1 = (*Curl_cstrdup)(source->CAfile);
    dest->CAfile = pcVar1;
    if (dest->CAfile == (char *)0x0) {
      return false;
    }
  }
  if (source->clientcert == (char *)0x0) {
    dest->clientcert = (char *)0x0;
  }
  else {
    pcVar1 = (*Curl_cstrdup)(source->clientcert);
    dest->clientcert = pcVar1;
    if (dest->clientcert == (char *)0x0) {
      return false;
    }
  }
  if (source->random_file == (char *)0x0) {
    dest->random_file = (char *)0x0;
  }
  else {
    pcVar1 = (*Curl_cstrdup)(source->random_file);
    dest->random_file = pcVar1;
    if (dest->random_file == (char *)0x0) {
      return false;
    }
  }
  if (source->egdsocket == (char *)0x0) {
    dest->egdsocket = (char *)0x0;
  }
  else {
    pcVar1 = (*Curl_cstrdup)(source->egdsocket);
    dest->egdsocket = pcVar1;
    if (dest->egdsocket == (char *)0x0) {
      return false;
    }
  }
  if (source->cipher_list == (char *)0x0) {
    dest->cipher_list = (char *)0x0;
  }
  else {
    pcVar1 = (*Curl_cstrdup)(source->cipher_list);
    dest->cipher_list = pcVar1;
    if (dest->cipher_list == (char *)0x0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool
Curl_clone_primary_ssl_config(struct ssl_primary_config *source,
                              struct ssl_primary_config *dest)
{
  dest->version = source->version;
  dest->version_max = source->version_max;
  dest->verifypeer = source->verifypeer;
  dest->verifyhost = source->verifyhost;
  dest->verifystatus = source->verifystatus;
  dest->sessionid = source->sessionid;

  CLONE_STRING(CApath);
  CLONE_STRING(CAfile);
  CLONE_STRING(clientcert);
  CLONE_STRING(random_file);
  CLONE_STRING(egdsocket);
  CLONE_STRING(cipher_list);

  return TRUE;
}